

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

string * __thiscall
jsonnet::internal::strip_ws(string *__return_storage_ptr__,internal *this,string *s,uint margin)

{
  string *psVar1;
  string *extraout_RAX;
  string *psVar2;
  string *extraout_RAX_00;
  
  if (s == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,this,this);
    return extraout_RAX;
  }
  psVar1 = (string *)0x0;
  do {
    psVar2 = psVar1;
    if (((0x20 < (ulong)(byte)this[(long)psVar1]) ||
        ((0x100002200U >> ((ulong)(byte)this[(long)psVar1] & 0x3f) & 1) == 0)) ||
       (psVar2 = (string *)(ulong)margin, (string *)(ulong)margin == psVar1)) {
      psVar1 = s;
      if (psVar2 < s) goto LAB_0016133f;
      break;
    }
    psVar1 = (string *)((long)&(psVar1->_M_dataplus)._M_p + 1);
    psVar2 = s;
  } while (s != psVar1);
  goto LAB_0016135c;
  while (psVar1 = (string *)((long)&psVar1[-1].field_2 + 0xf), s = psVar2, psVar2 < psVar1) {
LAB_0016133f:
    s = psVar1;
    if ((0x20 < (ulong)(byte)(this + -1)[(long)psVar1]) ||
       ((0x100002200U >> ((ulong)(byte)(this + -1)[(long)psVar1] & 0x3f) & 1) == 0)) break;
  }
LAB_0016135c:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this + (long)&psVar2->_M_dataplus,
             this + (long)&s->_M_dataplus);
  return extraout_RAX_00;
}

Assistant:

static std::string strip_ws(const std::string &s, unsigned margin)
{
    if (s.size() == 0)
        return s;  // Avoid underflow below.
    size_t i = 0;
    while (i < s.length() && is_horz_ws(s[i]) && i < margin)
        i++;
    size_t j = s.size();
    while (j > i && is_horz_ws(s[j - 1])) {
        j--;
    }
    return std::string(&s[i], &s[j]);
}